

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool SeenLocal(CService *addr)

{
  iterator iVar1;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock20;
  unique_lock<std::mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)&uStack_28,&g_maplocalhost_mutex,"g_maplocalhost_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0x137,false);
  iVar1 = std::
          _Rb_tree<CNetAddr,_std::pair<const_CNetAddr,_LocalServiceInfo>,_std::_Select1st<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
          ::find(&mapLocalHost._M_t,&addr->super_CNetAddr);
  if ((_Rb_tree_header *)iVar1._M_node != &mapLocalHost._M_t._M_impl.super__Rb_tree_header) {
    iVar1._M_node[2]._M_color = iVar1._M_node[2]._M_color + _S_black;
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (_Rb_tree_header *)iVar1._M_node != &mapLocalHost._M_t._M_impl.super__Rb_tree_header;
  }
  __stack_chk_fail();
}

Assistant:

bool SeenLocal(const CService& addr)
{
    LOCK(g_maplocalhost_mutex);
    const auto it = mapLocalHost.find(addr);
    if (it == mapLocalHost.end()) return false;
    ++it->second.nScore;
    return true;
}